

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sentinel.cpp
# Opt level: O3

int AF_A_SentinelRefire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *t2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  AActor *self;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f74db;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f74cb;
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005f735c;
    pPVar6 = (self->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (self->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar8;
    bVar9 = pPVar6 == pPVar3;
    if (!bVar9 && !bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
    uVar5 = (uint)bVar8;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f74db;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005f74cb;
LAB_005f735c:
    self = (AActor *)0x0;
    pVVar7 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005f741c;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005f74cb:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005f74db;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar6 = (PClass *)puVar2[1];
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
          puVar2[1] = pPVar6;
        }
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f74db;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005f74cb;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f741c:
    A_FaceTarget(self);
    uVar5 = FRandom::GenRand32(&pr_sentinelrefire);
    if (0x1d < (uVar5 & 0xfe)) {
      t2 = (self->target).field_0.p;
      if (t2 != (AActor *)0x0) {
        if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((((0 < t2->health) && (bVar8 = P_CheckSight(self,t2,6), bVar8)) &&
               (bVar8 = P_HitFriend(self), !bVar8)) &&
              ((self->MissileState != (FState *)0x0 ||
               (bVar8 = AActor::CheckMeleeRange(self), bVar8)))) &&
             (uVar5 = FRandom::GenRand32(&pr_sentinelrefire), 0x27 < (uVar5 & 0xf8))) {
            return 0;
          }
        }
        else {
          (self->target).field_0.p = (AActor *)0x0;
        }
      }
      AActor::SetState(self,self->SeeState,false);
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005f74db:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SentinelRefire)
{
	PARAM_ACTION_PROLOGUE;

	A_FaceTarget (self);

	if (pr_sentinelrefire() >= 30)
	{
		if (self->target == NULL ||
			self->target->health <= 0 ||
			!P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) ||
			P_HitFriend(self) ||
			(self->MissileState == NULL && !self->CheckMeleeRange()) ||
			pr_sentinelrefire() < 40)
		{
			self->SetState (self->SeeState);
		}
	}
	return 0;
}